

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall kj::consumeNumber(kj *this,char **ptr)

{
  char cVar1;
  uint local_2c;
  char c;
  char *pcStack_28;
  uint result;
  char *p;
  char *start;
  char **ptr_local;
  
  start = (char *)ptr;
  ptr_local = (char **)this;
  p = skipSpace(*ptr);
  local_2c = 0;
  for (pcStack_28 = p; (cVar1 = *pcStack_28, '/' < cVar1 && (cVar1 < ':'));
      pcStack_28 = pcStack_28 + 1) {
    local_2c = local_2c * 10 + cVar1 + -0x30;
  }
  if (pcStack_28 == p) {
    Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
  }
  else {
    *(char **)start = pcStack_28;
    Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&local_2c);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static kj::Maybe<uint> consumeNumber(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  uint result = 0;

  for (;;) {
    char c = *p;
    if ('0' <= c && c <= '9') {
      result = result * 10 + (c - '0');
      ++p;
    } else {
      if (p == start) return nullptr;
      ptr = p;
      return result;
    }
  }
}